

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O3

CServerEntry * __thiscall
CServerBrowser::Find(CServerBrowser *this,int ServerlistType,NETADDR *Addr)

{
  int iVar1;
  uint uVar2;
  CServerEntry *a;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  auVar3 = psadbw(ZEXT416(*(uint *)Addr->ip),(undefined1  [16])0x0);
  uVar2 = auVar3._0_4_;
  if (Addr->type != 1) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)(Addr->ip + 4);
    auVar4 = psadbw(auVar4,(undefined1  [16])0x0);
    auVar5 = psadbw(ZEXT416(*(uint *)(Addr->ip + 0xc)),(undefined1  [16])0x0);
    uVar2 = (uint)(byte)(auVar5[0] + auVar4[0] + auVar3[0]);
  }
  a = this->m_aServerlist[ServerlistType].m_aServerlistIp[uVar2 & 0xff];
  while( true ) {
    if (a == (CServerEntry *)0x0) {
      return (CServerEntry *)0x0;
    }
    iVar1 = net_addr_comp(&a->m_Addr,Addr,1);
    if (iVar1 == 0) break;
    a = a->m_pNextIp;
  }
  return a;
}

Assistant:

CServerEntry *CServerBrowser::Find(int ServerlistType, const NETADDR &Addr)
{
	for(CServerEntry *pEntry = m_aServerlist[ServerlistType].m_aServerlistIp[AddrHash(&Addr)]; pEntry; pEntry = pEntry->m_pNextIp)
	{
		if(net_addr_comp(&pEntry->m_Addr, &Addr, true) == 0)
			return pEntry;
	}
	return (CServerEntry*)0;
}